

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

void __thiscall
crnlib::mip_level::assign
          (mip_level *this,dxt_image *p,pixel_format fmt,orientation_flags_t orient_flags)

{
  component_flags cVar1;
  
  clear(this);
  this->m_pDXTImage = p;
  this->m_width = p->m_width;
  this->m_height = p->m_height;
  this->m_orient_flags = orient_flags;
  if (fmt == PIXEL_FMT_INVALID) {
    fmt = PIXEL_FMT_INVALID;
    if ((ulong)(uint)p->m_format < 0xc) {
      fmt = *(pixel_format *)
             (
             "DXT1DX1ADXT3DXT5ATI1A2XYATI2ETC1ETC2ET2AET1SE2ASDXT1DX1ADXT3DXT5ATI1A2XYATI2ETC1ETC2ET2A"
             + (ulong)(uint)p->m_format * 4);
    }
  }
  this->m_format = fmt;
  cVar1 = pixel_format_helpers::get_component_flags(fmt);
  this->m_comp_flags = cVar1;
  return;
}

Assistant:

void mip_level::assign(dxt_image* p, pixel_format fmt, orientation_flags_t orient_flags) {
  CRNLIB_ASSERT(p);

  clear();

  m_pDXTImage = p;

  m_width = p->get_width();
  m_height = p->get_height();
  m_orient_flags = orient_flags;

  if (fmt != PIXEL_FMT_INVALID)
    m_format = fmt;
  else
    m_format = pixel_format_helpers::from_dxt_format(p->get_format());

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);
}